

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  appender aVar2;
  write_int_arg<unsigned_int> in_RDX;
  undefined1 in_SIL;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RDI;
  appender in_stack_00000058;
  undefined1 in_stack_00000070 [32];
  format_specs<char> *in_stack_ffffffffffffff28;
  loc_value *in_stack_ffffffffffffff30;
  format_specs<char> *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  char value_00;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffff48;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> specs_00;
  locale_ref in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff68;
  format_specs<char> *local_48;
  
  value_00 = (char)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  bVar1 = check_char_specs<char>(in_stack_ffffffffffffff28);
  if (bVar1) {
    aVar2 = write_char<char,fmt::v10::appender>
                      ((appender)in_stack_ffffffffffffff48.container,value_00,
                       in_stack_ffffffffffffff38);
    return (appender)
           aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  specs_00.container = in_RDI.container;
  if ((*(ushort *)((long)in_RDX + 9) >> 8 & 1) != 0) {
    loc_value::loc_value<unsigned_char,_0>
              (in_stack_ffffffffffffff30,(uchar)((ulong)in_stack_ffffffffffffff28 >> 0x38));
    bVar1 = write_loc(in_stack_00000058,(loc_value)in_stack_00000070,
                      (format_specs<char> *)loc.locale_,
                      (locale_ref)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    in_stack_ffffffffffffff38 = local_48;
    if (bVar1) {
      return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)in_RDI.container;
    }
  }
  make_write_int_arg<unsigned_char>
            ((uchar)((ulong)in_stack_ffffffffffffff38 >> 0x38),
             (sign_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
  aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._7_1_ = in_SIL;
  aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_7_ =
       in_stack_ffffffffffffff68;
  aVar2 = write_int_noinline<char,fmt::v10::appender,unsigned_int>
                    (aVar2,in_RDX,(format_specs<char> *)specs_00.container,in_stack_ffffffffffffff58
                    );
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const format_specs<Char>& specs, locale_ref loc = {})
    -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<unsigned_type>(value), specs, loc);
}